

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
          (sysbvm_context_t *context,sysbvm_tuple_t astNode_,sysbvm_tuple_t environment_)

{
  sysbvm_tuple_t sVar1;
  sysbvm_stackFrameRecord_t local_68;
  undefined8 local_58;
  sysbvm_tuple_t *psStack_50;
  sysbvm_tuple_t local_40;
  sysbvm_tuple_t local_38;
  sysbvm_tuple_t local_30;
  sysbvm_tuple_t sStack_28;
  undefined8 local_20;
  
  psStack_50 = &local_40;
  local_30 = 0;
  sStack_28 = 0;
  local_20 = 0;
  local_68.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_68.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_68._12_4_ = 0;
  local_58 = 5;
  local_40 = astNode_;
  local_38 = environment_;
  sysbvm_stackFrame_pushRecord(&local_68);
  local_30 = sysbvm_analysisAndEvaluationEnvironment_getExpectedType(context,local_38);
  sStack_28 = sysbvm_interpreter_analyzeASTIfNeededWithEnvironment(context,local_40,local_38);
  sysbvm_stackFrame_popRecord(&local_68);
  sVar1 = sysbvm_interpreter_applyCoercionToASTNodeIntoType(context,sStack_28,local_38,local_30);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(sysbvm_context_t *context, sysbvm_tuple_t astNode_, sysbvm_tuple_t environment_)
{
    struct {
        sysbvm_tuple_t astNode;
        sysbvm_tuple_t environment;
        sysbvm_tuple_t targetType;
        sysbvm_tuple_t result;

        sysbvm_tuple_t coercionExpressionType;
    } gcFrame = {
        .astNode = astNode_,
        .environment = environment_
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.targetType = sysbvm_analysisAndEvaluationEnvironment_getExpectedType(context, gcFrame.environment);
    gcFrame.result = sysbvm_interpreter_analyzeASTIfNeededWithEnvironment(context, gcFrame.astNode, gcFrame.environment);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return sysbvm_interpreter_applyCoercionToASTNodeIntoType(context, gcFrame.result, gcFrame.environment, gcFrame.targetType);
}